

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O2

void FAudio_OPERATIONSET_QueueSetEffectParameters
               (FAudioVoice *voice,uint32_t EffectIndex,void *pParameters,
               uint32_t ParametersByteSize,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  void *pvVar2;
  
  FAudio_PlatformLockMutex(voice->audio->operationLock);
  pFVar1 = QueueOperation(voice,FAUDIOOP_SETEFFECTPARAMETERS,OperationSet);
  (pFVar1->Data).SetEffectParameters.EffectIndex = EffectIndex;
  pvVar2 = (*voice->audio->pMalloc)((size_t)ParametersByteSize);
  (pFVar1->Data).SetEffectParameters.pParameters = pvVar2;
  SDL_memcpy(pvVar2,pParameters,ParametersByteSize);
  (pFVar1->Data).SetEffectParameters.ParametersByteSize = ParametersByteSize;
  FAudio_PlatformUnlockMutex(voice->audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetEffectParameters(
	FAudioVoice *voice,
	uint32_t EffectIndex,
	const void *pParameters,
	uint32_t ParametersByteSize,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETEFFECTPARAMETERS,
		OperationSet
	);

	op->Data.SetEffectParameters.EffectIndex = EffectIndex;
	op->Data.SetEffectParameters.pParameters = voice->audio->pMalloc(
		ParametersByteSize
	);
	FAudio_memcpy(
		op->Data.SetEffectParameters.pParameters,
		pParameters,
		ParametersByteSize
	);
	op->Data.SetEffectParameters.ParametersByteSize = ParametersByteSize;

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}